

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardsDriver.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  reference pvVar3;
  int i;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  int iVar8;
  size_type sVar9;
  Hand hand;
  Deck deck;
  _Vector_base<CardType,_std::allocator<CardType>_> local_68;
  _Vector_base<CardType,_std::allocator<CardType>_> local_48;
  
  Deck::Deck(&deck,9);
  Deck::createDeck(&deck);
  uVar1 = *deck.deckSize;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n--------------------\n Creation of a Deck \n--------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  sVar9 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = sVar9;
  }
  iVar4 = 0;
  iVar5 = 0;
  iVar8 = 0;
  for (; uVar6 != sVar9; sVar9 = sVar9 + 1) {
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(deck.deckPointer,sVar9);
    if (*pvVar3 == INFANTRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar8 = iVar8 + 1;
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(deck.deckPointer,sVar9);
    if (*pvVar3 == ARTILLERY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar5 = iVar5 + 1;
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(deck.deckPointer,sVar9);
    if (*pvVar3 == CAVALRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar4 = iVar4 + 1;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\n------------------\n Deck Composition \n------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of [INFANTRY] cards: [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar8);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of [ARTILLERY] cards: [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of [CAVALRY] cards: [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\n---------------\n Hand of Cards \n---------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  Hand::Hand(&hand);
  Deck::draw(&deck,&hand);
  Deck::draw(&deck,&hand);
  Deck::draw(&deck,&hand);
  uVar6 = (ulong)((long)((hand.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)((hand.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>)
                       ._M_impl.super__Vector_impl_data._M_start) >> 2;
  sVar9 = 0;
  sVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    sVar7 = 0;
  }
  for (; sVar7 != sVar9; sVar9 = sVar9 + 1) {
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
    if (*pvVar3 == INFANTRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
    if (*pvVar3 == ARTILLERY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
    if (*pvVar3 == CAVALRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\n-------------------\n Exchange Function \n-------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,0);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)&local_68,pvVar3);
  pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,1);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)&local_68,pvVar3);
  pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,2);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)&local_68,pvVar3);
  std::vector<CardType,_std::allocator<CardType>_>::vector
            ((vector<CardType,_std::allocator<CardType>_> *)&local_48,
             (vector<CardType,_std::allocator<CardType>_> *)&local_68);
  iVar4 = Hand::exchange(&hand,&deck,(vector<CardType,_std::allocator<CardType>_> *)&local_48);
  std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(&local_48);
  if (iVar4 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Invalid set of cards exchanged. They must either: All be of the same type or all be different."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"\nCards attempted to exchange:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
      pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
      if (*pvVar3 == INFANTRY) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
      if (*pvVar3 == ARTILLERY) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar9);
      if (*pvVar3 == CAVALRY) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Number of armies received: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\n-----------------------\n Current Hand of Cards \n-----------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar6 = (ulong)((long)((hand.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)((hand.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>)
                       ._M_impl.super__Vector_impl_data._M_start) >> 2;
  sVar7 = 0;
  sVar9 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    sVar9 = sVar7;
  }
  for (; sVar9 != sVar7; sVar7 = sVar7 + 1) {
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar7);
    if (*pvVar3 == INFANTRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar7);
    if (*pvVar3 == ARTILLERY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pvVar3 = std::vector<CardType,_std::allocator<CardType>_>::at(hand.handPointer,sVar7);
    if (*pvVar3 == CAVALRY) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base(&local_68);
  Hand::~Hand(&hand);
  Deck::~Deck(&deck);
  return 0;
}

Assistant:

int main() {

    int infantryCount = 0;
    int artilleryCount = 0;
    int cavalryCount = 0;

    Deck deck = Deck(9);
    deck.createDeck();

    int size = *deck.getNumberOfCards();

    std::cout << "\n--------------------\n Creation of a Deck \n--------------------" << std::endl;

    for (int i = 0; i < size; i++) {

        if (deck.getDeck()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (deck.getDeck()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (deck.getDeck()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n------------------\n Deck Composition \n------------------" << std::endl;

    std::cout << "Number of [INFANTRY] cards: [" << infantryCount << "]" << std::endl;
    std::cout << "Number of [ARTILLERY] cards: [" << artilleryCount << "]" << std::endl;
    std::cout << "Number of [CAVALRY] cards: [" << cavalryCount << "]" << std::endl;

    std::cout << "\n\n---------------\n Hand of Cards \n---------------" << std::endl;

    Hand hand = Hand();
    deck.draw(hand);
    deck.draw(hand);
    deck.draw(hand);

    int handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n-------------------\n Exchange Function \n-------------------" << std::endl;

    std::vector<CardType> cardsExchanged = std::vector<CardType>();
    cardsExchanged.push_back(hand.getHand()->at(0));
    cardsExchanged.push_back(hand.getHand()->at(1));
    cardsExchanged.push_back(hand.getHand()->at(2));

    int armiesReceived = Hand::exchange(&hand, &deck, cardsExchanged);

    if (armiesReceived == -1) {
        std::cout << ("Invalid set of cards exchanged. They must either: All be of the same type or all be different.")
                  << std::endl;
        std::cout << ("\nCards attempted to exchange:") << std::endl;

        for (int i = 0; i < 3; i++) {
            if (hand.getHand()->at(i) == 0) {
                std::cout << "Card: [INFANTRY]" << std::endl;
                infantryCount++;
            }
            if (hand.getHand()->at(i) == 1) {
                std::cout << "Card: [ARTILLERY]" << std::endl;
                artilleryCount++;
            }
            if (hand.getHand()->at(i) == 2) {
                std::cout << "Card: [CAVALRY]" << std::endl;
                cavalryCount++;
            }
        }

    } else {
        std::cout << "Number of armies received: " << armiesReceived << std::endl;
    }

    std::cout << "\n\n-----------------------\n Current Hand of Cards \n-----------------------" << std::endl;

    handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }
}